

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O2

vector<candidate_variant,_std::allocator<candidate_variant>_> *
find_variants(vector<candidate_variant,_std::allocator<candidate_variant>_> *__return_storage_ptr__,
             vector<t_GSA,_std::allocator<t_GSA>_> *gsa_cluster)

{
  pointer puVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint uVar5;
  pointer paVar6;
  uint64_t uVar7;
  pointer puVar8;
  pointer puVar9;
  pointer pvVar10;
  undefined1 uVar11;
  bool bVar12;
  int iVar13;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  uchar *puVar14;
  ulong uVar15;
  pointer puVar16;
  long lVar17;
  ulong uVar18;
  byte bVar19;
  uint64_t i;
  ulong uVar20;
  ulong uVar21;
  pointer puVar22;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_0;
  ulong local_190;
  ulong local_188;
  vector<unsigned_char,_std::allocator<unsigned_char>_> all_chars;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  candidate_variant local_a0;
  
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)frequent_char_0.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,4,
             (value_type_conflict3 *)&frequent_char_0,(allocator_type *)&frequent_char_1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&counts,2,(value_type *)&local_a0,(allocator_type *)&all_chars);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0);
  lVar17 = 0xc;
  local_188 = 0;
  local_190 = 0;
  uVar21 = 0;
  for (uVar20 = 0;
      pvVar10 = counts.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      paVar6 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar20 < (ulong)((long)(gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 4);
      uVar20 = uVar20 + 1) {
    uVar15 = (ulong)*(uint *)((long)paVar6 + lVar17 + -0xc);
    uVar18 = (ulong)*(uint *)((long)paVar6 + lVar17 + -4);
    if (uVar21 < uVar18) {
      local_190 = uVar15;
      local_188 = (ulong)*(uint *)((long)paVar6 + lVar17 + -8);
    }
    if (uVar21 <= uVar18) {
      uVar21 = uVar18;
    }
    bVar12 = nr_reads1 <= uVar15;
    iVar13 = base_to_int(*(uchar *)((long)&paVar6->text + lVar17));
    puVar1 = pvVar10[bVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start + iVar13;
    *puVar1 = *puVar1 + 1;
    lVar17 = lVar17 + 0x10;
  }
  if ((ulong)(long)k_right <= uVar21) {
    frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar19 = 0;
    for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
      if ((uint)mcov_out <=
          ((counts.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar21]) {
        uVar11 = (char)(0x54474341 >> (bVar19 & 0x1f));
        if (3 < uVar21) {
          uVar11 = 0x41;
        }
        local_a0.left_context_idx_0.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_a0.left_context_idx_0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,uVar11);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&frequent_char_0,(uchar *)&local_a0);
      }
      if ((uint)mcov_out <=
          counts.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21]) {
        uVar11 = (undefined1)(0x54474341 >> (bVar19 & 0x1f));
        if (3 < uVar21) {
          uVar11 = 0x41;
        }
        local_a0.left_context_idx_0.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_a0.left_context_idx_0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,uVar11);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&frequent_char_1,(uchar *)&local_a0);
      }
      bVar19 = bVar19 + 8;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&all_chars,&frequent_char_0);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&all_chars,
               (const_iterator)
               all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
              (&all_chars,(const_iterator)__first._M_current,
               (const_iterator)
               all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (((((frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start) &&
          ((ulong)((long)frequent_char_0.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)frequent_char_0.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start) < 3)) &&
         (frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start)) &&
        (((ulong)((long)frequent_char_1.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)frequent_char_1.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) < 3 &&
         (bVar12 = std::operator==(&frequent_char_0,&frequent_char_1),
         puVar9 = frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish, !bVar12)))) &&
       (puVar14 = frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       (ulong)((long)all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start) < 4)) {
      for (; puVar8 = frequent_char_1.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish, puVar14 != puVar9; puVar14 = puVar14 + 1) {
        uVar2 = *puVar14;
        for (puVar16 = frequent_char_1.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar16 != puVar8; puVar16 = puVar16 + 1) {
          uVar3 = *puVar16;
          if (uVar2 != uVar3) {
            left_pos_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            left_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            left_pos_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            left_pos_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            left_pos_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            left_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            left_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            left_idx_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            left_pos_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            left_pos_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            left_idx_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            left_idx_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar17 = 0xc;
            for (uVar21 = 0; uVar7 = nr_reads1,
                paVar6 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                uVar21 < (ulong)((long)(gsa_cluster->
                                       super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)paVar6 >> 4);
                uVar21 = uVar21 + 1) {
              puVar22 = (pointer)(ulong)*(uint *)((long)paVar6 + lVar17 + -0xc);
              uVar5 = *(uint *)((long)paVar6 + lVar17 + -8);
              uVar18 = (ulong)*(uint *)((long)paVar6 + lVar17 + -4);
              uVar4 = *(uchar *)((long)&paVar6->text + lVar17);
              uVar15 = (ulong)k_left;
              uVar20 = (ulong)k_right;
              if (((uVar15 <= uVar5) && (uVar4 == uVar2)) &&
                 ((puVar22 < nr_reads1 &&
                  ((uVar20 <= uVar18 &&
                   ((ulong)((long)left_idx_0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)left_idx_0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) <
                    (ulong)(long)consensus_reads)))))) {
                local_a0.left_context_idx_0.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = puVar22;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&left_idx_0,(unsigned_long *)&local_a0);
                local_a0.left_context_idx_0.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)(ulong)(uVar5 - k_left);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&left_pos_0,(unsigned_long *)&local_a0);
                uVar15 = (ulong)k_left;
                uVar20 = (ulong)k_right;
              }
              if ((((uVar15 <= uVar5) && (uVar4 == uVar3)) && (uVar7 <= puVar22)) &&
                 ((uVar20 <= uVar18 &&
                  ((ulong)((long)left_idx_1.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)left_idx_1.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) <
                   (ulong)(long)consensus_reads)))) {
                local_a0.left_context_idx_0.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = puVar22;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&left_idx_1,(unsigned_long *)&local_a0);
                local_a0.left_context_idx_0.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)(ulong)(uVar5 - k_left);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&left_pos_1,(unsigned_long *)&local_a0);
              }
              lVar17 = lVar17 + 0x10;
            }
            if ((left_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 left_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start) &&
               (left_idx_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                left_idx_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start)) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_a0.left_context_idx_0,&left_idx_0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_a0.left_context_pos_0,&left_pos_0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_a0.left_context_idx_1,&left_idx_1);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_a0.left_context_pos_1,&left_pos_1);
              local_a0.right_context_idx = local_190;
              local_a0.right_context_pos = local_188;
              std::vector<candidate_variant,_std::allocator<candidate_variant>_>::
              emplace_back<candidate_variant>(__return_storage_ptr__,&local_a0);
              candidate_variant::~candidate_variant(&local_a0);
            }
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&left_idx_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      );
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&left_pos_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      );
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&left_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      );
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&left_pos_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      );
          }
        }
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&all_chars.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&frequent_char_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&frequent_char_0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&counts);
  return __return_storage_ptr__;
}

Assistant:

vector<candidate_variant> find_variants(vector<t_GSA> & gsa_cluster){

	vector<candidate_variant>  out;

	auto counts = vector<vector<unsigned int> >(2,vector<unsigned int>(4,0));

	uint64_t max_lcp_val = 0;//value of max LCP in cluster
	uint64_t max_lcp_read_idx = 0;//index of read with max LCP in cluster
	uint64_t max_lcp_read_pos = 0;//position in read where max LCP starts

	for(uint64_t i=0;i<gsa_cluster.size();++i){

		auto e = gsa_cluster[i];

		//find read with max LCP
		if(e.lcp > max_lcp_val){

			max_lcp_val = e.lcp;
			max_lcp_read_idx = e.text;
			max_lcp_read_pos = e.suff;

		}

		bool sample = e.text < nr_reads1 ? 0 : 1;
		counts[sample?1:0][base_to_int(e.bwt)]++;

	}

	//discard cluster if max LCP is less than k_right
	if(max_lcp_val < k_right) return out;

	//compute the lists of frequent characters in indiv 0 and 1
	vector<unsigned char> frequent_char_0;
	vector<unsigned char> frequent_char_1;

	for(int c=0;c<4;++c){

		if(counts[0][c] >= mcov_out) frequent_char_0.push_back(int_to_base(c));
		if(counts[1][c] >= mcov_out) frequent_char_1.push_back(int_to_base(c));

	}

	std::sort(frequent_char_0.begin(), frequent_char_0.end());
	std::sort(frequent_char_1.begin(), frequent_char_1.end());

	//all variations observed in cluster
	auto all_chars = frequent_char_0;
	all_chars.insert(all_chars.begin(), frequent_char_1.begin(), frequent_char_1.end());
	std::sort( all_chars.begin(), all_chars.end() );
	all_chars.erase(std::unique( all_chars.begin(), all_chars.end() ), all_chars.end());

	//filter: remove clusters that cannot reflect a variation
	if(	frequent_char_0.size()==0 or // not covered enough
		frequent_char_1.size()==0 or // not covered enough
		frequent_char_0.size()>2 or // we require at most 2 alleles per individual
		frequent_char_1.size()>2 or // we require  at most 2 alleles per individual
		frequent_char_0 == frequent_char_1 or // same alleles: probably both heterozigous / multiple region (and no variants)
		all_chars.size() > 3	//4 or more distinct frequent characters in the cluster (probably multiple region)
	){

		return out;

	}

	for(auto c0 : frequent_char_0){

		for(auto c1 : frequent_char_1){

			if(c0 != c1){

				//compute max length of left context in indiv. 0 and 1, on the reads whose left
				//contexts end with c0 and c1, respectively.

				vector<uint64_t> left_pos_0;
				vector<uint64_t> left_idx_0;

				vector<uint64_t> left_pos_1;
				vector<uint64_t> left_idx_1;

				for(uint64_t i=0;i<gsa_cluster.size();++i){

					auto e = gsa_cluster[i];
					bool sample = e.text < nr_reads1 ? 0 : 1;
					uint64_t prefix_len = e.suff;
					unsigned char ch = e.bwt;
					uint64_t lcp = e.lcp;

					if(	prefix_len >= k_left and
						ch == c0 and
						sample == 0 and
						lcp >= k_right and //TODO test
						left_idx_0.size()<consensus_reads){

						left_idx_0.push_back(e.text);
						left_pos_0.push_back(e.suff-k_left);

					}

					if(	prefix_len >= k_left and
						ch == c1 and
						sample == 1 and
						lcp >= k_right and //TODO test
						left_idx_1.size()<consensus_reads){

						left_idx_1.push_back(e.text);
						left_pos_1.push_back(e.suff-k_left);

					}

				}

				if(left_idx_0.size()>0 and left_idx_1.size()>0){

					out.push_back(
						{

							left_idx_0, left_pos_0,
							left_idx_1, left_pos_1,
							max_lcp_read_idx, max_lcp_read_pos

						}
					);

				}

			}

		}

	}

	return out;

}